

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::FinalizeBindOrderExpression
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogicalTypeId LVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pEVar5;
  BoundConstantExpression *pBVar6;
  uint64_t uVar7;
  idx_t index;
  vector<duckdb::Value,_true> *this_00;
  const_reference pvVar8;
  const_reference pvVar9;
  InternalException *pIVar10;
  BinderException *this_01;
  type expr_00;
  string collation;
  string local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  string local_70;
  string local_50;
  
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar5->super_BaseExpression);
  LVar2 = (pBVar6->value).type_.id_;
  if (LVar2 == VARCHAR) {
    *(undefined8 *)this = 0;
  }
  else if (LVar2 == STRUCT) {
    this_00 = StructValue::GetChildren(&pBVar6->value);
    if (0x80 < (ulong)((long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Expected one or two children: index and optional collation",""
                );
      InternalException::InternalException(pIVar10,&local_a0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar8 = vector<duckdb::Value,_true>::operator[](this_00,0);
    uVar7 = UBigIntValue::Get(pvVar8);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    if ((long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start == 0x80) {
      pvVar8 = vector<duckdb::Value,_true>::operator[](this_00,1);
      StringValue::Get_abi_cxx11_(pvVar8);
      ::std::__cxx11::string::_M_assign((string *)&local_a0);
    }
    local_80._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    CreateOrderExpression
              (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )&local_80,names,sql_types,table_index,uVar7);
    paVar1 = &local_a0.field_2;
    if (local_80._M_head_impl != (Expression *)0x0) {
      (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_80._M_head_impl = (Expression *)0x0;
    if (local_a0._M_string_length != 0) {
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[](sql_types,uVar7);
      if (pvVar9->id_ != VARCHAR) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"COLLATE can only be applied to varchar columns","");
        BinderException::BinderException<>(this_01,expr_00,&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == paVar1) {
        local_50.field_2._8_8_ = local_a0.field_2._8_8_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50._M_dataplus._M_p = local_a0._M_dataplus._M_p;
      }
      local_50.field_2._M_allocated_capacity._1_7_ = local_a0.field_2._M_allocated_capacity._1_7_;
      local_50.field_2._M_local_buf[0] = local_a0.field_2._M_local_buf[0];
      local_50._M_string_length = local_a0._M_string_length;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      LogicalType::VARCHAR_COLLATION((LogicalType *)&local_70,&local_50);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      (pEVar5->return_type).id_ = (LogicalTypeId)local_70._M_dataplus._M_p;
      (pEVar5->return_type).physical_type_ = local_70._M_dataplus._M_p._1_1_;
      peVar3 = (pEVar5->return_type).type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (pEVar5->return_type).type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_70._M_string_length;
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.field_2._M_allocated_capacity;
      local_70._M_string_length = (size_type)peVar3;
      local_70.field_2._M_allocated_capacity = (size_type)p_Var4;
      LogicalType::~LogicalType((LogicalType *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  else {
    if (LVar2 != UBIGINT) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Unknown type in FinalizeBindOrderExpression","");
      InternalException::InternalException(pIVar10,&local_a0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar7 = UBigIntValue::Get(&pBVar6->value);
    local_78._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    index = SelectBindState::GetFinalIndex(bind_state,uVar7);
    CreateOrderExpression
              (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )&local_78,names,sql_types,table_index,index);
    if (local_78._M_head_impl != (Expression *)0x0) {
      (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> FinalizeBindOrderExpression(unique_ptr<Expression> expr, idx_t table_index,
                                                   const vector<string> &names, const vector<LogicalType> &sql_types,
                                                   const SelectBindState &bind_state) {
	auto &constant = expr->Cast<BoundConstantExpression>();
	switch (constant.value.type().id()) {
	case LogicalTypeId::UBIGINT: {
		// index
		auto index = UBigIntValue::Get(constant.value);
		return CreateOrderExpression(std::move(expr), names, sql_types, table_index, bind_state.GetFinalIndex(index));
	}
	case LogicalTypeId::VARCHAR: {
		// ORDER BY ALL
		return nullptr;
	}
	case LogicalTypeId::STRUCT: {
		// collation
		auto &struct_values = StructValue::GetChildren(constant.value);
		if (struct_values.size() > 2) {
			throw InternalException("Expected one or two children: index and optional collation");
		}
		auto index = UBigIntValue::Get(struct_values[0]);
		string collation;
		if (struct_values.size() == 2) {
			collation = StringValue::Get(struct_values[1]);
		}
		auto result = CreateOrderExpression(std::move(expr), names, sql_types, table_index, index);
		if (!collation.empty()) {
			if (sql_types[index].id() != LogicalTypeId::VARCHAR) {
				throw BinderException(*result, "COLLATE can only be applied to varchar columns");
			}
			result->return_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
		}
		return result;
	}
	default:
		throw InternalException("Unknown type in FinalizeBindOrderExpression");
	}
}